

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O0

int __thiscall
ncnn::ROIAlign::forward
          (ROIAlign *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  int *piVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar3;
  float fVar4;
  double dVar5;
  float v_1;
  float x_1;
  int bx_1;
  float y_1;
  int by_1;
  float sum_1;
  int pw_1;
  int ph_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  float count;
  int roi_bin_grid_w;
  int roi_bin_grid_h;
  float v;
  float x;
  int bx;
  float y;
  int by;
  float sum;
  int area;
  bool is_empty;
  int bin_grid_w;
  int bin_grid_h;
  float wend;
  float hend;
  float wstart;
  float hstart;
  int pw;
  int ph;
  float *outptr;
  float *ptr;
  int q;
  float bin_size_h;
  float bin_size_w;
  float roi_h;
  float roi_w;
  float roi_y2;
  float roi_x2;
  float roi_y1;
  float roi_x1;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m_2;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff990;
  size_t in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9a0;
  int _c;
  undefined8 in_stack_fffffffffffff9a8;
  Mat *in_stack_fffffffffffff9b0;
  float local_630;
  float local_62c;
  float local_628;
  bool local_621;
  float local_620;
  float local_61c;
  float local_5ac;
  int local_5a8;
  float local_5a4;
  int local_5a0;
  float local_59c;
  int local_598;
  int local_594;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined4 local_578;
  Allocator *local_570;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined8 local_550;
  void *local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined4 local_528;
  Allocator *local_520;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined8 local_500;
  float *local_4f8;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  float local_4e4;
  int local_4e0;
  int local_4dc;
  float local_4d8;
  float local_4d4;
  int local_4d0;
  float local_4cc;
  int local_4c8;
  float local_4c4;
  int local_4c0;
  bool local_4b9;
  int local_4b8;
  int local_4b4;
  float local_4b0;
  float local_4ac;
  float local_4a8;
  float local_4a4;
  float local_4a0;
  float local_49c;
  float local_498;
  float local_494;
  float local_490;
  float local_48c;
  float local_488;
  float local_484;
  int local_480;
  int local_47c;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined4 local_460;
  Allocator *local_458;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined8 local_438;
  void *local_430;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined4 local_400;
  Allocator *local_3f8;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  float *local_3d0;
  int local_3c4;
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float *local_398;
  reference local_390;
  const_reference local_388;
  int local_37c;
  size_t local_378;
  int local_370;
  int local_36c;
  const_reference local_368;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_358;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_350;
  int local_33c;
  reference local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  const_reference local_320;
  undefined1 local_315;
  int local_314;
  const_reference local_310;
  undefined8 *local_308;
  undefined1 local_2fd;
  int local_2fc;
  const_reference local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2d8;
  undefined8 *local_2c8;
  undefined8 *local_2b8;
  undefined8 *local_2a8;
  undefined1 local_295;
  int local_294;
  reference local_290;
  undefined8 *local_288;
  undefined1 local_275;
  int local_274;
  reference local_270;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_250;
  reference local_248;
  Allocator *local_240;
  int local_234;
  size_t local_230;
  void *local_228;
  int local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  Allocator *local_208;
  int local_1fc;
  size_t local_1f8;
  void *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  Allocator *local_1d0;
  int local_1c4;
  size_t local_1c0;
  float *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  Allocator *local_198;
  int local_18c;
  size_t local_188;
  float *local_180;
  int local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  long local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 local_12c;
  long local_128;
  undefined8 *local_e8;
  undefined8 *local_c8;
  undefined8 *local_a8;
  undefined8 *local_88;
  
  _c = (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20);
  local_358 = in_RDX;
  local_350 = in_RSI;
  local_368 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_36c = local_368->w;
  local_370 = local_368->h;
  local_378 = local_368->elemsize;
  local_37c = local_368->c;
  local_388 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_350,1);
  local_390 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_358,0);
  Mat::create(in_stack_fffffffffffff9b0,(int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
              (int)in_stack_fffffffffffff9a8,_c,in_stack_fffffffffffff998,in_stack_fffffffffffff990)
  ;
  local_338 = local_390;
  bVar3 = true;
  if (local_390->data != (void *)0x0) {
    local_248 = local_390;
    bVar3 = local_390->cstep * (long)local_390->c == 0;
  }
  if (bVar3) {
    local_33c = -100;
  }
  else {
    local_320 = local_388;
    local_398 = (float *)local_388->data;
    local_39c = *local_398 * *(float *)(in_RDI + 0xd8);
    local_3a0 = local_398[1] * *(float *)(in_RDI + 0xd8);
    local_3a4 = local_398[2] * *(float *)(in_RDI + 0xd8);
    local_3a8 = local_398[3] * *(float *)(in_RDI + 0xd8);
    if ((*(byte *)(in_RDI + 0xe0) & 1) != 0) {
      local_39c = local_39c - 0.5;
      local_3a0 = local_3a0 - 0.5;
      local_3a4 = local_3a4 - 0.5;
      local_3a8 = local_3a8 - 0.5;
    }
    local_3ac = local_3a4 - local_39c;
    local_3b0 = local_3a8 - local_3a0;
    if ((*(byte *)(in_RDI + 0xe0) & 1) == 0) {
      local_3b4 = 1.0;
      pfVar1 = std::max<float>(&local_3ac,&local_3b4);
      local_3ac = *pfVar1;
      local_3b8 = 1.0;
      pfVar1 = std::max<float>(&local_3b0,&local_3b8);
      local_3b0 = *pfVar1;
    }
    local_3bc = local_3ac / (float)*(int *)(in_RDI + 0xd0);
    local_3c0 = local_3b0 / (float)*(int *)(in_RDI + 0xd4);
    if (*(int *)(in_RDI + 0xe4) == 0) {
      for (local_3c4 = 0; local_3c4 < local_37c; local_3c4 = local_3c4 + 1) {
        local_2f0 = &local_418;
        local_1a4 = local_368->w;
        local_1a8 = local_368->h;
        local_1ac = local_368->d;
        local_3d0 = (float *)((long)local_368->data +
                             local_368->cstep * (long)local_3c4 * local_368->elemsize);
        local_1c0 = local_368->elemsize;
        local_1c4 = local_368->elempack;
        local_1d0 = local_368->allocator;
        local_1a0 = &local_418;
        local_148 = (long)local_1a4 * (long)local_1a8 * local_1c0;
        local_328 = &local_418;
        local_2d8 = &local_418;
        local_268 = &local_478;
        local_214 = local_390->w;
        local_218 = local_390->h;
        local_21c = local_390->d;
        local_430 = (void *)((long)local_390->data +
                            local_390->cstep * (long)local_3c4 * local_390->elemsize);
        local_230 = local_390->elemsize;
        local_234 = local_390->elempack;
        local_240 = local_390->allocator;
        local_210 = &local_478;
        local_128 = (long)local_214 * (long)local_218 * local_230;
        local_250 = &local_478;
        local_2c8 = &local_478;
        local_3e0 = 0;
        local_3e4 = 0;
        local_3e8 = 0;
        local_3ec = 0;
        local_400 = 0;
        local_408 = 0;
        local_410 = 0;
        local_418 = 0;
        local_12c = 0x10;
        local_14c = 0x10;
        local_270 = local_390;
        local_274 = local_3c4;
        local_275 = 1;
        local_2f8 = local_368;
        local_2fc = local_3c4;
        local_2fd = 1;
        local_3d8 = 0;
        local_3f0 = 0;
        local_478 = 0;
        local_468 = 0;
        local_460 = 0;
        local_450 = 0;
        local_44c = 0;
        local_448 = 0;
        local_444 = 0;
        local_440 = 0;
        local_438 = 0;
        local_470 = 0;
        local_228 = local_430;
        local_1b8 = local_3d0;
        local_a8 = local_2c8;
        local_88 = local_2d8;
        local_458 = local_240;
        local_3f8 = local_1d0;
        for (local_47c = 0; local_47c < *(int *)(in_RDI + 0xd4); local_47c = local_47c + 1) {
          for (local_480 = 0; local_480 < *(int *)(in_RDI + 0xd0); local_480 = local_480 + 1) {
            local_484 = local_3a0 + (float)local_47c * local_3c0;
            local_488 = local_39c + (float)local_480 * local_3bc;
            local_48c = local_3a0 + (float)(local_47c + 1) * local_3c0;
            local_490 = local_39c + (float)(local_480 + 1) * local_3bc;
            local_494 = 0.0;
            pfVar1 = std::max<float>(&local_484,&local_494);
            local_498 = (float)local_370;
            pfVar1 = std::min<float>(pfVar1,&local_498);
            local_484 = *pfVar1;
            local_49c = 0.0;
            pfVar1 = std::max<float>(&local_488,&local_49c);
            local_4a0 = (float)local_36c;
            pfVar1 = std::min<float>(pfVar1,&local_4a0);
            local_488 = *pfVar1;
            local_4a4 = 0.0;
            pfVar1 = std::max<float>(&local_48c,&local_4a4);
            local_4a8 = (float)local_370;
            pfVar1 = std::min<float>(pfVar1,&local_4a8);
            local_48c = *pfVar1;
            local_4ac = 0.0;
            pfVar1 = std::max<float>(&local_490,&local_4ac);
            local_4b0 = (float)local_36c;
            pfVar1 = std::min<float>(pfVar1,&local_4b0);
            local_490 = *pfVar1;
            if (*(int *)(in_RDI + 0xdc) < 1) {
              dVar5 = std::ceil((double)(ulong)(uint)(local_48c - local_484));
              local_61c = SUB84(dVar5,0);
            }
            else {
              local_61c = (float)*(int *)(in_RDI + 0xdc);
            }
            local_4b4 = (int)local_61c;
            if (*(int *)(in_RDI + 0xdc) < 1) {
              dVar5 = std::ceil((double)(ulong)(uint)(local_490 - local_488));
              local_620 = SUB84(dVar5,0);
            }
            else {
              local_620 = (float)*(int *)(in_RDI + 0xdc);
            }
            local_4b8 = (int)local_620;
            local_621 = local_48c <= local_484 || local_490 <= local_488;
            local_4b9 = local_621;
            local_4c0 = local_4b4 * local_4b8;
            local_4c4 = 0.0;
            for (local_4c8 = 0; local_4c8 < local_4b4; local_4c8 = local_4c8 + 1) {
              local_4cc = local_484 + (((float)local_4c8 + 0.5) * local_3c0) / (float)local_4b4;
              for (local_4d0 = 0; local_4d0 < local_4b8; local_4d0 = local_4d0 + 1) {
                local_4d4 = local_488 + (((float)local_4d0 + 0.5) * local_3bc) / (float)local_4b8;
                local_4d8 = bilinear_interpolate(local_3d0,local_36c,local_370,local_4d4,local_4cc);
                local_4c4 = local_4d8 + local_4c4;
              }
            }
            if ((local_4b9 & 1U) == 0) {
              local_628 = local_4c4 / (float)local_4c0;
            }
            else {
              local_628 = 0.0;
            }
            *(float *)((long)local_430 + (long)local_480 * 4) = local_628;
          }
          local_430 = (void *)((long)local_430 + (long)*(int *)(in_RDI + 0xd0) * 4);
        }
      }
    }
    else if (*(int *)(in_RDI + 0xe4) == 1) {
      if (*(int *)(in_RDI + 0xdc) < 1) {
        dVar5 = std::ceil((double)(ulong)(uint)(local_3b0 / (float)*(int *)(in_RDI + 0xd4)));
        local_62c = SUB84(dVar5,0);
      }
      else {
        local_62c = (float)*(int *)(in_RDI + 0xdc);
      }
      local_4dc = (int)local_62c;
      if (*(int *)(in_RDI + 0xdc) < 1) {
        dVar5 = std::ceil((double)(ulong)(uint)(local_3ac / (float)*(int *)(in_RDI + 0xd0)));
        local_630 = SUB84(dVar5,0);
      }
      else {
        local_630 = (float)*(int *)(in_RDI + 0xdc);
      }
      local_4e0 = (int)local_630;
      local_4e8 = local_4dc * local_4e0;
      local_4ec = 1;
      piVar2 = std::max<int>(&local_4e8,&local_4ec);
      local_4e4 = (float)*piVar2;
      for (local_4f0 = 0; local_4f0 < local_37c; local_4f0 = local_4f0 + 1) {
        local_308 = &local_540;
        local_16c = local_368->w;
        local_170 = local_368->h;
        local_174 = local_368->d;
        local_4f8 = (float *)((long)local_368->data +
                             local_368->cstep * (long)local_4f0 * local_368->elemsize);
        local_188 = local_368->elemsize;
        local_18c = local_368->elempack;
        local_198 = local_368->allocator;
        local_168 = &local_540;
        local_158 = (long)local_16c * (long)local_170 * local_188;
        local_330 = &local_540;
        local_2b8 = &local_540;
        local_15c = 0x10;
        local_310 = local_368;
        local_314 = local_4f0;
        local_315 = 1;
        local_540 = 0;
        local_530 = 0;
        local_528 = 0;
        local_518 = 0;
        local_514 = 0;
        local_510 = 0;
        local_50c = 0;
        local_508 = 0;
        local_500 = 0;
        local_538 = 0;
        local_288 = &local_590;
        local_1dc = local_390->w;
        local_1e0 = local_390->h;
        local_1e4 = local_390->d;
        local_548 = (void *)((long)local_390->data +
                            local_390->cstep * (long)local_4f0 * local_390->elemsize);
        local_1f8 = local_390->elemsize;
        local_1fc = local_390->elempack;
        local_208 = local_390->allocator;
        local_1d8 = &local_590;
        local_138 = (long)local_1dc * (long)local_1e0 * local_1f8;
        local_258 = &local_590;
        local_2a8 = &local_590;
        local_13c = 0x10;
        local_290 = local_390;
        local_294 = local_4f0;
        local_295 = 1;
        local_590 = 0;
        local_580 = 0;
        local_578 = 0;
        local_568 = 0;
        local_564 = 0;
        local_560 = 0;
        local_55c = 0;
        local_558 = 0;
        local_550 = 0;
        local_588 = 0;
        local_1f0 = local_548;
        local_180 = local_4f8;
        local_e8 = local_2a8;
        local_c8 = local_2b8;
        local_570 = local_208;
        local_520 = local_198;
        for (local_594 = 0; local_594 < *(int *)(in_RDI + 0xd4); local_594 = local_594 + 1) {
          for (local_598 = 0; local_598 < *(int *)(in_RDI + 0xd0); local_598 = local_598 + 1) {
            local_59c = 0.0;
            for (local_5a0 = 0; local_5a0 < local_4dc; local_5a0 = local_5a0 + 1) {
              local_5a4 = local_3a0 + (float)local_594 * local_3c0 +
                          (((float)local_5a0 + 0.5) * local_3c0) / (float)local_4dc;
              for (local_5a8 = 0; local_5a8 < local_4e0; local_5a8 = local_5a8 + 1) {
                local_5ac = local_39c + (float)local_598 * local_3bc +
                            (((float)local_5a8 + 0.5) * local_3bc) / (float)local_4e0;
                if ((((-1.0 <= local_5a4) && (local_5a4 <= (float)local_370)) && (-1.0 <= local_5ac)
                    ) && (local_5ac <= (float)local_36c)) {
                  if (local_5a4 <= 0.0) {
                    local_5a4 = 0.0;
                  }
                  if (local_5ac <= 0.0) {
                    local_5ac = 0.0;
                  }
                  fVar4 = bilinear_interpolate(local_4f8,local_36c,local_370,local_5ac,local_5a4);
                  local_59c = fVar4 + local_59c;
                }
              }
            }
            *(float *)((long)local_548 + (long)local_598 * 4) = local_59c / local_4e4;
          }
          local_548 = (void *)((long)local_548 + (long)*(int *)(in_RDI + 0xd0) * 4);
        }
      }
    }
    local_33c = 0;
  }
  return local_33c;
}

Assistant:

int ROIAlign::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roi_ptr[0] * spatial_scale;
    float roi_y1 = roi_ptr[1] * spatial_scale;
    float roi_x2 = roi_ptr[2] * spatial_scale;
    float roi_y2 = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_x1 -= 0.5f;
        roi_y1 -= 0.5f;
        roi_x2 -= 0.5f;
        roi_y2 -= 0.5f;
    }

    float roi_w = roi_x2 - roi_x1;
    float roi_h = roi_y2 - roi_y1;

    if (!aligned)
    {
        roi_w = std::max(roi_w, 1.f);
        roi_h = std::max(roi_h, 1.f);
    }

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    if (version == 0)
    {
        // original version
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_y1 + ph * bin_size_h;
                    float wstart = roi_x1 + pw * bin_size_w;
                    float hend = roi_y1 + (ph + 1) * bin_size_h;
                    float wend = roi_x1 + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)h);
                    wstart = std::min(std::max(wstart, 0.f), (float)w);
                    hend = std::min(std::max(hend, 0.f), (float)h);
                    wend = std::min(std::max(wend, 0.f), (float)w);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;

                            // bilinear interpolate at (x,y)
                            float v = bilinear_interpolate(ptr, w, h, x, y);

                            sum += v;
                        }
                    }

                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_h / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_w / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float sum = 0.f;
                    for (int by = 0; by < roi_bin_grid_h; by++)
                    {
                        float y = roi_y1 + ph * bin_size_h + (by + 0.5f) * bin_size_h / (float)roi_bin_grid_h;

                        for (int bx = 0; bx < roi_bin_grid_w; bx++)
                        {
                            float x = roi_x1 + pw * bin_size_w + (bx + 0.5f) * bin_size_w / (float)roi_bin_grid_w;

                            if (y < -1.0 || y > h || x < -1.0 || x > w)
                            {
                                // empty
                                continue;
                            }
                            else
                            {
                                if (y <= 0) y = 0;
                                if (x <= 0) x = 0;

                                // bilinear interpolate at (x,y)
                                float v = bilinear_interpolate(ptr, w, h, x, y);
                                sum += v;
                            }
                        }
                    }
                    outptr[pw] = sum / count;
                }

                outptr += pooled_width;
            }
        }
    }

    return 0;
}